

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
bioparser::Parser<bioparser::test::SamOverlap>::~Parser(Parser<bioparser::test::SamOverlap> *this)

{
  this->_vptr_Parser = (_func_int **)&PTR__Parser_0014ff18;
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->storage_).super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->buffer_).super__Vector_base<char,_std::allocator<char>_>);
  std::unique_ptr<gzFile_s,_int_(*)(gzFile_s_*)>::~unique_ptr(&this->file_);
  return;
}

Assistant:

virtual ~Parser() {}